

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcg_random.hpp
# Opt level: O0

uint pcg_detail::xsh_rr_mixin<unsigned_int,_unsigned_long>::output(unsigned_long internal)

{
  uint uVar1;
  ulong in_RDI;
  uint result;
  bitcount_t amprot;
  bitcount_t rot;
  bitcount_t xshift;
  bitcount_t bottomspare;
  bitcount_t topspare;
  bitcount_t mask;
  bitcount_t amplifier;
  bitcount_t opbits;
  bitcount_t wantedopbits;
  bitcount_t sparebits;
  bitcount_t xtypebits;
  bitcount_t bits;
  
  uVar1 = pcg_extras::rotr<unsigned_int>
                    ((uint)((in_RDI >> 0x12 ^ in_RDI) >> 0x1b),(byte)(in_RDI >> 0x3b));
  return uVar1;
}

Assistant:

static xtype output(itype internal)
    {
        constexpr bitcount_t bits        = bitcount_t(sizeof(itype) * 8);
        constexpr bitcount_t xtypebits   = bitcount_t(sizeof(xtype)*8);
        constexpr bitcount_t sparebits   = bits - xtypebits;
        constexpr bitcount_t wantedopbits =
                              xtypebits >= 128 ? 7
                            : xtypebits >=  64 ? 6
                            : xtypebits >=  32 ? 5
                            : xtypebits >=  16 ? 4
                            :                    3;
        constexpr bitcount_t opbits =
                              sparebits >= wantedopbits ? wantedopbits
                                                        : sparebits;
        constexpr bitcount_t amplifier = wantedopbits - opbits;
        constexpr bitcount_t mask = (1 << opbits) - 1;
        constexpr bitcount_t topspare    = opbits;
        constexpr bitcount_t bottomspare = sparebits - topspare;
        constexpr bitcount_t xshift      = (topspare + xtypebits)/2;
        bitcount_t rot = opbits ? bitcount_t(internal >> (bits - opbits)) & mask
                                : 0;
        bitcount_t amprot = (rot << amplifier) & mask;
        internal ^= internal >> xshift;
        xtype result = xtype(internal >> bottomspare);
        result = rotr(result, amprot);
        return result;
    }